

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Region.cpp
# Opt level: O1

Region * __thiscall Region::GetSelfOrFirstTryAncestor(Region *this)

{
  Region *region;
  Region *pRVar1;
  
  pRVar1 = this;
  if (this->selfOrFirstTryAncestor == (Region *)0x0) {
    do {
      if (pRVar1->type == RegionTypeTry) break;
      pRVar1 = pRVar1->parent;
    } while (pRVar1 != (Region *)0x0);
    this->selfOrFirstTryAncestor = pRVar1;
  }
  return this->selfOrFirstTryAncestor;
}

Assistant:

Region *
Region::GetSelfOrFirstTryAncestor()
{
    if (!this->selfOrFirstTryAncestor)
    {
        Region* region = this;
        while (region && region->GetType() != RegionTypeTry)
        {
            region = region->GetParent();
        }
        this->selfOrFirstTryAncestor = region;
    }
    return this->selfOrFirstTryAncestor;
}